

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall DBOPL::Operator::UpdateFrequency(Operator *this)

{
  uint uVar1;
  Bit32u BVar2;
  byte bVar3;
  
  uVar1 = this->chanData & 0x3ff;
  bVar3 = (byte)(this->chanData >> 10);
  this->waveAdd = (uVar1 << (bVar3 & 0x1f)) * this->freqMul;
  if ((this->reg20 & 0x40) == 0) {
    this->vibStrength = '\0';
    BVar2 = 0;
  }
  else {
    uVar1 = uVar1 >> 7;
    this->vibStrength = (Bit8u)uVar1;
    BVar2 = (uVar1 << (bVar3 & 0x1f)) * this->freqMul;
  }
  this->vibrato = BVar2;
  return;
}

Assistant:

void Operator::UpdateFrequency(  ) {
	Bit32u freq = chanData & (( 1 << 10 ) - 1);
	Bit32u block = (chanData >> 10) & 0xff;
#ifdef WAVE_PRECISION
	block = 7 - block;
	waveAdd = ( freq * freqMul ) >> block;
#else
	waveAdd = ( freq << block ) * freqMul;
#endif
	if ( reg20 & MASK_VIBRATO ) {
		vibStrength = (Bit8u)(freq >> 7);

#ifdef WAVE_PRECISION
		vibrato = ( vibStrength * freqMul ) >> block;
#else
		vibrato = ( vibStrength << block ) * freqMul;
#endif
	} else {
		vibStrength = 0;
		vibrato = 0;
	}
}